

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packed_func.h
# Opt level: O1

string * __thiscall
tvm::runtime::TVMType2String_abi_cxx11_(string *__return_storage_ptr__,runtime *this,TVMType t)

{
  ostringstream os;
  ostringstream aoStack_198 [112];
  ios_base local_128 [264];
  
  if (((ulong)this & 0xff00) == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::ostringstream::ostringstream(aoStack_198);
    operator<<((ostream *)aoStack_198,
               (TVMType)((uint)this & 0xffff00ff | ((uint)((ulong)this >> 8) & 0xff) << 8));
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream(aoStack_198);
    std::ios_base::~ios_base(local_128);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string TVMType2String(TVMType t) {
  if (t.bits == 0)
    return "";
#ifndef _LIBCPP_SGX_NO_IOSTREAMS
  std::ostringstream os;
  os << t;
  return os.str();
#else
  if (t.bits == 1 && t.lanes == 1 && t.code == kDLUInt) {
    return "bool";
  }
  repr += TypeCode2Str(t.code);
  if (t.code == kHandle)
    return repr;
  repr += std::to_string(static_cast<int>(t.bits));
  if (t.lanes != 1) {
    repr += "x" + std::to_string(static_cast<int>(t.lanes));
  }
  return repr;
#endif
}